

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O3

ssize_t __thiscall
zmq::mailbox_safe_t::recv(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  __pid_t _Var1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  void *extraout_RDX;
  size_t __n_00;
  size_t __n_01;
  void *__n_02;
  void *__buf_00;
  void *extraout_RDX_00;
  ssize_t sVar5;
  undefined4 in_register_00000034;
  void *__buf_01;
  mutex_t *__stat_loc;
  
  __buf_01 = (void *)CONCAT44(in_register_00000034,__fd);
  sVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
  sVar5 = 0;
  if ((char)sVar3 == '\0') {
    if ((int)__buf == 0) {
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->_sync);
      if (iVar2 != 0) {
        recv(iVar2,__buf_01,__n_01,(int)__n);
      }
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->_sync);
      __buf_00 = __n_02;
      if (iVar2 != 0) {
        recv(iVar2,__buf_01,(size_t)__n_02,(int)__n);
        __buf_00 = extraout_RDX_00;
      }
    }
    else {
      __stat_loc = this->_sync;
      _Var1 = condition_variable_t::wait(&this->_cond_var,__stat_loc);
      iVar2 = (int)__n;
      __buf_00 = extraout_RDX;
      if (_Var1 == -1) {
        piVar4 = __errno_location();
        __fd_00 = *piVar4;
        if (__fd_00 == 4) {
          return 0xffffffff;
        }
        if (__fd_00 == 0xb) {
          return 0xffffffff;
        }
        recv(__fd_00,__stat_loc,__n_00,iVar2);
        return 0xffffffff;
      }
    }
    sVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf_00,__n);
    if ((char)sVar3 == '\0') {
      piVar4 = __errno_location();
      *piVar4 = 0xb;
      sVar5 = 0xffffffff;
    }
  }
  return sVar5;
}

Assistant:

int zmq::mailbox_safe_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_cpipe.read (cmd_))
        return 0;

    //  If the timeout is zero, it will be quicker to release the lock, giving other a chance to send a command
    //  and immediately relock it.
    if (timeout_ == 0) {
        _sync->unlock ();
        _sync->lock ();
    } else {
        //  Wait for signal from the command sender.
        const int rc = _cond_var.wait (_sync, timeout_);
        if (rc == -1) {
            errno_assert (errno == EAGAIN || errno == EINTR);
            return -1;
        }
    }

    //  Another thread may already fetch the command
    const bool ok = _cpipe.read (cmd_);

    if (!ok) {
        errno = EAGAIN;
        return -1;
    }

    return 0;
}